

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandSatoko(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  satoko_opts_t *__ptr;
  long lVar3;
  char *pcVar4;
  satoko_opts_t *psVar5;
  char *format;
  satoko_opts_t *psVar6;
  long lVar7;
  byte bVar8;
  satoko_t *p;
  timespec ts;
  satoko_opts_t opts;
  satoko_t *local_98;
  timespec local_90;
  satoko_opts_t local_80;
  
  bVar8 = 0;
  satoko_default_opts(&local_80);
  __ptr = Cmd_DeriveOptionFromSettings(argc,argv);
  if (__ptr != (satoko_opts_t *)0x0) {
    psVar5 = __ptr;
    psVar6 = &local_80;
    for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
      psVar6->conf_limit = psVar5->conf_limit;
      psVar5 = (satoko_opts_t *)((long)psVar5 + (ulong)bVar8 * -0x10 + 8);
      psVar6 = (satoko_opts_t *)((long)psVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    free(__ptr);
    if (globalUtilOptind + 1 == argc) {
      iVar1 = satoko_parse_dimacs(argv[globalUtilOptind],&local_98);
      satoko_configure(local_98,&local_80);
      iVar2 = clock_gettime(3,&local_90);
      if (iVar2 < 0) {
        lVar3 = 1;
      }
      else {
        lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
        lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_90.tv_sec * -1000000;
      }
      if (iVar1 == 1) {
        iVar1 = satoko_solve(local_98);
      }
      pcVar4 = "UNSATISFIABLE  ";
      if (iVar1 == 1) {
        pcVar4 = "SATISFIABLE    ";
      }
      format = "UNDECIDED      ";
      if (iVar1 != 0) {
        format = pcVar4;
      }
      Abc_Print(1,format);
      iVar1 = clock_gettime(3,&local_90);
      if (iVar1 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
      }
      Abc_Print(1,"%s =","Time");
      Abc_Print(1,"%9.2f sec\n",(double)(lVar7 + lVar3) / 1000000.0);
      satoko_destroy(local_98);
      return 0;
    }
  }
  Abc_Print(-2,"usage: satoko [-CPDEFGHIJKLMNOQRS num] [-hv]<file>.cnf\n");
  Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",local_80.conf_limit);
  Abc_Print(-2,"\t-P num : limit on the number of propagations [default = %d]\n",local_80.conf_limit
           );
  Abc_Print(-2,"\n\tConstants used for restart heuristic:\n");
  Abc_Print(-2,
            "\t-D num : Constant value used by restart heuristics in forcing restarts [default = %f]\n"
            ,local_80.f_rst);
  Abc_Print(-2,
            "\t-E num : Constant value used by restart heuristics in  blocking restarts [default = %f]\n"
            ,local_80.b_rst);
  Abc_Print(-2,"\t-F num : Lower bound n.of conflicts for start blocking restarts [default = %d]\n",
            (ulong)local_80.fst_block_rst);
  Abc_Print(-2,
            "\t-G num : Size of the moving avarege queue for LBD (force restart) [default = %d]\n",
            (ulong)local_80.sz_lbd_bqueue);
  Abc_Print(-2,
            "\t-H num : Size of the moving avarege queue for Trail size (block restart) [default = %d]\n"
            ,(ulong)local_80.sz_trail_bqueue);
  Abc_Print(-2,"\n\tConstants used for clause database reduction heuristic:\n");
  Abc_Print(-2,"\t-I num : N.of conflicts before first clause databese reduction [default = %d]\n",
            (ulong)local_80.n_conf_fst_reduce);
  Abc_Print(-2,"\t-J num : Increment to reduce [default = %d]\n",(ulong)local_80.inc_reduce);
  Abc_Print(-2,"\t-K num : Special increment to reduce [default = %d]\n",
            (ulong)local_80.inc_special_reduce);
  Abc_Print(-2,
            "\t-L num : Protecs clauses from deletion for one turn if its LBD is lower [default = %d]\n"
            ,(ulong)local_80.lbd_freeze_clause);
  Abc_Print(-2,"\t-M num : Percentage of learned clauses to remove [default = %d]\n",
            (ulong)(uint)(int)(local_80.learnt_ratio * 100.0));
  Abc_Print(-2,"\t-N num : Max percentage of garbage in clause database [default = %d]\n",
            (ulong)(uint)(int)(local_80.garbage_max_ratio * 100.0));
  Abc_Print(-2,"\n\tConstants used for binary resolution (clause minimization):\n");
  Abc_Print(-2,"\t-O num : Max clause size for binary resolution [default = %d]\n",
            (ulong)local_80.clause_max_sz_bin_resol);
  Abc_Print(-2,"\t-Q num : Min clause LBD for binary resolution [default = %d]\n",
            (ulong)local_80.clause_min_lbd_bin_resol);
  Abc_Print(-2,"\n\tConstants used for branching (VSIDS heuristic):\n");
  Abc_Print(-2,
            "\t-R num : Clause activity decay factor (when using float clause activity) [default = %f]\n"
            ,(double)local_80.clause_decay);
  Abc_Print(-2,"\t-S num : Varibale activity decay factor [default = %f]\n",local_80.var_decay);
  pcVar4 = "yes";
  if (local_80.verbose == '\0') {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\n\t-v     : prints verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandSatoko( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern satoko_opts_t * Cmd_DeriveOptionFromSettings( int argc, char ** argv );

    // create default options
    satoko_opts_t opts, * popts;
    satoko_default_opts(&opts);

    // override default options
    popts = Cmd_DeriveOptionFromSettings( argc, argv );
    if ( popts == NULL )
        goto usage;
    memcpy( &opts, popts, sizeof(satoko_opts_t) );
    ABC_FREE( popts );

    if ( argc == globalUtilOptind + 1 )
    {
        abctime clk;
        char * pFileName = argv[globalUtilOptind];
        satoko_t * p;
        int status;

        status = satoko_parse_dimacs( pFileName, &p );
        satoko_configure(p, &opts);

        clk = Abc_Clock();
        if ( status == SATOKO_OK )
            status = satoko_solve( p );

        if ( status == SATOKO_UNDEC )
            Abc_Print( 1, "UNDECIDED      " );
        else if ( status == SATOKO_SAT )
            Abc_Print( 1, "SATISFIABLE    " );
        else
            Abc_Print( 1, "UNSATISFIABLE  " );

        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

        satoko_destroy( p );
        return 0;
    }

usage:
#ifdef SATOKO_ACT_VAR_FIXED
    Abc_Print( -2, "usage: satoko [-CPDEFGHIJKLMNOQRSTU num] [-hv]<file>.cnf\n" );
#else
    Abc_Print( -2, "usage: satoko [-CPDEFGHIJKLMNOQRS num] [-hv]<file>.cnf\n" );
#endif
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n", opts.conf_limit );
    Abc_Print( -2, "\t-P num : limit on the number of propagations [default = %d]\n", opts.conf_limit );
    Abc_Print( -2, "\n\tConstants used for restart heuristic:\n");
    Abc_Print( -2, "\t-D num : Constant value used by restart heuristics in forcing restarts [default = %f]\n", opts.f_rst );
    Abc_Print( -2, "\t-E num : Constant value used by restart heuristics in  blocking restarts [default = %f]\n", opts.b_rst );
    Abc_Print( -2, "\t-F num : Lower bound n.of conflicts for start blocking restarts [default = %d]\n", opts.fst_block_rst );
    Abc_Print( -2, "\t-G num : Size of the moving avarege queue for LBD (force restart) [default = %d]\n", opts.sz_lbd_bqueue );
    Abc_Print( -2, "\t-H num : Size of the moving avarege queue for Trail size (block restart) [default = %d]\n", opts.sz_trail_bqueue );
    Abc_Print( -2, "\n\tConstants used for clause database reduction heuristic:\n");
    Abc_Print( -2, "\t-I num : N.of conflicts before first clause databese reduction [default = %d]\n", opts.n_conf_fst_reduce );
    Abc_Print( -2, "\t-J num : Increment to reduce [default = %d]\n", opts.inc_reduce );
    Abc_Print( -2, "\t-K num : Special increment to reduce [default = %d]\n", opts.inc_special_reduce );
    Abc_Print( -2, "\t-L num : Protecs clauses from deletion for one turn if its LBD is lower [default = %d]\n", opts.lbd_freeze_clause );
    Abc_Print( -2, "\t-M num : Percentage of learned clauses to remove [default = %d]\n", ( int )( 100 * opts.learnt_ratio ) );
    Abc_Print( -2, "\t-N num : Max percentage of garbage in clause database [default = %d]\n", ( int )( 100 * opts.garbage_max_ratio ) );
    Abc_Print( -2, "\n\tConstants used for binary resolution (clause minimization):\n");
    Abc_Print( -2, "\t-O num : Max clause size for binary resolution [default = %d]\n", opts.clause_max_sz_bin_resol );
    Abc_Print( -2, "\t-Q num : Min clause LBD for binary resolution [default = %d]\n", opts.clause_min_lbd_bin_resol );
    Abc_Print( -2, "\n\tConstants used for branching (VSIDS heuristic):\n");
    Abc_Print( -2, "\t-R num : Clause activity decay factor (when using float clause activity) [default = %f]\n", opts.clause_decay );
    Abc_Print( -2, "\t-S num : Varibale activity decay factor [default = %f]\n", opts.var_decay );
#ifdef SATOKO_ACT_VAR_FIXED
    Abc_Print( -2, "\t-T num : Variable activity limit valeu [default = 0x%08X]\n", opts.var_act_limit );
    Abc_Print( -2, "\t-U num : Variable activity re-scale factor [default = 0x%08X]\n", opts.var_act_rescale );
#endif
    Abc_Print( -2, "\n\t-v     : prints verbose information [default = %s]\n", opts.verbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}